

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::detail::stringifyBinaryExpr<bool,bool>
          (String *__return_storage_ptr__,detail *this,bool *lhs,char *op,bool *rhs)

{
  char *pcVar1;
  char *pcVar2;
  String SStack_88;
  String local_70;
  String local_58;
  String local_40;
  
  pcVar1 = "firstTag.secondTag().isFinished() == false";
  pcVar2 = "firstTag.secondTag().isFinished() == false";
  if (*this != (detail)0x0) {
    pcVar2 = "firstTag.secondTag().isFinished() == true";
  }
  String::String(&local_58,pcVar2 + 0x25);
  String::String(&local_70,lhs);
  operator+(&local_40,&local_58,&local_70);
  if (*op != '\0') {
    pcVar1 = "firstTag.secondTag().isFinished() == true";
  }
  String::String(&SStack_88,pcVar1 + 0x25);
  operator+(__return_storage_ptr__,&local_40,&SStack_88);
  String::~String(&SStack_88);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }